

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void __thiscall Display::checkWindowSize(Display *this)

{
  bool bVar1;
  int iVar2;
  int field_height;
  int mine_count;
  int window_width;
  int window_height;
  runtime_error *this_00;
  string sStack_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  int local_98;
  int local_94;
  
  iVar2 = Controller::getWidth(&this->controller);
  field_height = Controller::getHeight(&this->controller);
  Controller::getMinefield((Minefield *)&stack0xffffffffffffff68,&this->controller);
  mine_count = Minefield::getMineCount((Minefield *)&stack0xffffffffffffff68);
  Minefield::~Minefield((Minefield *)&stack0xffffffffffffff68);
  window_width = (*((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_IODevice[9])();
  window_height =
       (*((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         _vptr_IODevice[8])();
  bVar1 = isWindowSizeSufficient(iVar2,field_height,mine_count,window_width,window_height);
  if (bVar1) {
    return;
  }
  getRequiredWindowSize((Display *)&stack0xffffffffffffff68,iVar2,field_height,mine_count);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_1f8,local_94);
  std::operator+(&local_1d8,&local_1f8,"x");
  std::__cxx11::to_string(&local_218,local_98);
  std::operator+(&local_1b8,&local_1d8,&local_218);
  std::operator+(&local_198,&local_1b8," terminal required to display this ");
  std::__cxx11::to_string(&local_238,iVar2);
  std::operator+(&local_178,&local_198,&local_238);
  std::operator+(&local_158,&local_178,"x");
  std::__cxx11::to_string(&local_258,field_height);
  std::operator+(&local_138,&local_158,&local_258);
  std::operator+(&local_118,&local_138," minefield (Current: ");
  iVar2 = (*((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IODevice[9])();
  std::__cxx11::to_string(&local_278,iVar2);
  std::operator+(&local_f8,&local_118,&local_278);
  std::operator+(&local_d8,&local_f8,"x");
  iVar2 = (*((this->io).super___shared_ptr<IODevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IODevice[8])();
  std::__cxx11::to_string(&sStack_298,iVar2);
  std::operator+(&local_b8,&local_d8,&sStack_298);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff68,&local_b8,")");
  std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffff68);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Display::checkWindowSize() {
    int minefield_width = controller.getWidth();
    int minefield_height = controller.getHeight();
    int mine_count = controller.getMinefield().getMineCount();

    if (!isWindowSizeSufficient(minefield_width, minefield_height, mine_count, io->getWidth(), io->getHeight())) {
        int required_width, required_height;
        std::tie(required_width, required_height) = getRequiredWindowSize(minefield_width, minefield_height, mine_count); 
        throw std::runtime_error(std::to_string(required_width) + "x" + std::to_string(required_height) + " terminal required to display this " + std::to_string(minefield_width) + "x" + std::to_string(minefield_height) + " minefield (Current: " + std::to_string(io->getWidth()) + "x" + std::to_string(io->getHeight()) + ")");
    }
}